

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * monty_add(MontyContext *mc,mp_int *x,mp_int *y)

{
  mp_int *b;
  uint uVar1;
  mp_int *r;
  BignumCarry BVar2;
  
  b = mc->m;
  r = mp_make_sized(b->nw);
  BVar2 = mp_add_into_internal(r,x,y);
  uVar1 = mp_cmp_hs(r,b);
  mp_cond_sub_into(r,r,b,(uint)BVar2 | uVar1);
  return r;
}

Assistant:

mp_int *monty_add(MontyContext *mc, mp_int *x, mp_int *y)
{
    return mp_modadd_in_range(x, y, mc->m);
}